

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

size_type __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find
          (basic_string_view<char,_std::char_traits<char>_> *this,
          basic_string_view<char,_std::char_traits<char>_> v,size_type pos)

{
  char *pcVar1;
  size_type sVar2;
  
  pcVar1 = v.data_;
  if (pcVar1 == (char *)0x0 && v.size_ != 0) {
    __assert_fail("v.size() == 0 || v.data() != nssv_nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/src/license_generator/../inja/inja.hpp"
                  ,0x292,
                  "size_type nonstd::sv_lite::basic_string_view<char>::find(basic_string_view<CharT, Traits>, size_type) const [CharT = char, Traits = std::char_traits<char>]"
                 );
  }
  if (pos < this->size_) {
    pcVar1 = std::
             __search<char_const*,char_const*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(char_const&,char_const&)>>
                       (this->data_ + pos,this->data_ + this->size_,pcVar1,pcVar1 + v.size_,
                        (_Iter_comp_iter<bool_(*)(const_char_&,_const_char_&)>)0x19a5f0);
    sVar2 = 0xffffffffffffffff;
    if (this->data_ + this->size_ != pcVar1) {
      sVar2 = (long)pcVar1 - (long)this->data_;
    }
  }
  else {
    sVar2 = 0xffffffffffffffff;
  }
  return sVar2;
}

Assistant:

nssv_constexpr14 size_type find(basic_string_view v, size_type pos = 0) const nssv_noexcept  // (1)
		{
			return assert(v.size() == 0 || v.data() != nssv_nullptr),
				   pos >= size() ? npos : to_pos(std::search(cbegin() + pos, cend(), v.cbegin(), v.cend(), Traits::eq));
		}